

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrtrns.cpp
# Opt level: O2

UChar * u_strFromJavaModifiedUTF8WithSub_63
                  (UChar *dest,int32_t destCapacity,int32_t *pDestLength,char *src,int32_t srcLength
                  ,UChar32 subchar,int32_t *pNumSubstitutions,UErrorCode *pErrorCode)

{
  char cVar1;
  byte bVar2;
  uint8_t uVar3;
  int32_t iVar4;
  uint *puVar5;
  int iVar6;
  size_t sVar7;
  long lVar8;
  UChar UVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  UChar *pUVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  uint local_60;
  int32_t local_5c;
  UChar *local_58;
  long local_50;
  UChar *local_48;
  uint local_3c;
  uint *local_38;
  
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (((-2 < srcLength) && (src != (char *)0x0 || srcLength == 0)) &&
       (((subchar < 0x110000 && -1 < destCapacity) && (destCapacity == 0 || dest != (UChar *)0x0))
        && (subchar & 0xfffff800U) != 0xd800)) {
      if (pNumSubstitutions != (int32_t *)0x0) {
        *pNumSubstitutions = 0;
      }
      local_48 = dest + (uint)destCapacity;
      iVar4 = destCapacity;
      pUVar14 = dest;
      puVar5 = (uint *)pDestLength;
      if (srcLength < 0) {
        uVar12 = 0;
        for (pUVar14 = dest; (cVar1 = src[uVar12], '\0' < cVar1 && (pUVar14 < local_48));
            pUVar14 = pUVar14 + 1) {
          *pUVar14 = (short)cVar1;
          uVar12 = uVar12 + 1;
        }
        if (cVar1 == '\0') {
          if (pDestLength != (int32_t *)0x0) {
            *pDestLength = (int32_t)uVar12;
          }
LAB_001b268b:
          u_terminateUChars_63(dest,destCapacity,(int32_t)uVar12,pErrorCode);
          return dest;
        }
        src = src + uVar12;
        local_5c = destCapacity;
        local_58 = dest;
        local_38 = (uint *)pDestLength;
        sVar7 = strlen(src);
        srcLength = (int32_t)sVar7;
        dest = pUVar14;
        iVar4 = local_5c;
        pUVar14 = local_58;
        puVar5 = local_38;
      }
      local_38 = puVar5;
      local_58 = pUVar14;
      local_5c = iVar4;
      local_60 = 0;
      local_50 = (long)srcLength;
      iVar19 = 0;
      do {
        uVar18 = local_60;
        iVar10 = (int)((ulong)((long)local_48 - (long)dest) >> 1);
        lVar13 = (long)(int)local_60;
        iVar6 = srcLength - local_60;
        if (((0 < srcLength) && (iVar6 <= iVar10)) && (-1 < *src)) {
          uVar11 = local_60;
          if ((int)local_60 < srcLength) {
            uVar11 = srcLength;
          }
          for (; uVar17 = uVar11, lVar13 < local_50; lVar13 = lVar13 + 1) {
            uVar17 = (uint)lVar13;
            if ((char)((uint8_t *)src)[lVar13] < '\0') break;
            *dest = (short)(char)((uint8_t *)src)[lVar13];
            dest = dest + 1;
            local_60 = uVar17 + 1;
          }
          iVar10 = iVar10 - (uVar17 - uVar18);
          iVar6 = iVar6 - (uVar17 - uVar18);
        }
        if (0xffff < subchar) {
LAB_001b244d:
          local_50 = CONCAT44(local_50._4_4_,((uint)subchar >> 10) - 0x2840);
          local_3c = subchar & 0x3ffU | 0xdc00;
LAB_001b2470:
          uVar12 = (ulong)local_60;
          pUVar14 = dest;
LAB_001b2477:
          uVar12 = uVar12 & 0xffffffff;
          do {
            iVar6 = 0;
            iVar10 = (int)uVar12;
            if ((srcLength <= iVar10) || (local_48 <= pUVar14)) {
LAB_001b25aa:
              uVar16 = (long)pUVar14 - (long)local_58;
              uVar18 = local_60;
              goto LAB_001b25ba;
            }
            lVar13 = (long)iVar10;
            uVar12 = lVar13 + 1;
            local_60 = (uint)uVar12;
            bVar2 = ((uint8_t *)src)[lVar13];
            if (-1 < (char)bVar2) goto LAB_001b2529;
            if (bVar2 < 0xe0) {
              if (((bVar2 < 0xc0) || (srcLength <= (int)local_60)) ||
                 (0x3f < (byte)(((uint8_t *)src)[uVar12] ^ 0x80))) goto LAB_001b2536;
              UVar9 = (ushort)((bVar2 & 0x1f) << 6) | ((uint8_t *)src)[uVar12] ^ 0x80;
              iVar6 = 2;
            }
            else {
              if (((0xef < bVar2) || (srcLength <= (int)(lVar13 + 2))) ||
                 ((0x3f < (byte)(((uint8_t *)src)[uVar12] ^ 0x80) ||
                  (0x3f < (byte)(((uint8_t *)src)[lVar13 + 2] ^ 0x80))))) {
LAB_001b2536:
                if (subchar < 0) goto LAB_001b2651;
                utf8_nextCharSafeBody_63
                          ((uint8_t *)src,(int32_t *)&local_60,srcLength,(uint)bVar2,-1);
                iVar19 = iVar19 + 1;
                dest = pUVar14 + 1;
                if ((uint)subchar < 0x10000) {
                  *pUVar14 = (UChar)subchar;
                }
                else {
                  *pUVar14 = (UChar)local_50;
                  if (local_48 <= dest) {
                    pUVar14 = pUVar14 + 1;
                    iVar6 = 1;
                    goto LAB_001b25aa;
                  }
                  pUVar14[1] = (UChar)local_3c;
                  dest = pUVar14 + 2;
                }
                goto LAB_001b2470;
              }
              UVar9 = (ushort)bVar2 << 0xc | ((uint8_t *)src)[lVar13 + 2] ^ 0x80 |
                      (((uint8_t *)src)[uVar12] ^ 0x80) << 6;
              iVar6 = 3;
            }
            *pUVar14 = UVar9;
            local_60 = iVar10 + iVar6;
            uVar12 = (ulong)local_60;
            pUVar14 = pUVar14 + 1;
          } while( true );
        }
        iVar15 = iVar6 / 3;
        if (iVar10 < iVar6 / 3) {
          iVar15 = iVar10;
        }
        if (iVar15 < 3) goto LAB_001b244d;
        iVar15 = iVar15 + 1;
        do {
          lVar8 = (long)(int)local_60;
          lVar13 = lVar8 + 1;
          bVar2 = ((uint8_t *)src)[lVar8];
          if ((char)bVar2 < '\0') {
            if (bVar2 < 0xe0) {
              if ((bVar2 < 0xc0) || (0x3f < (byte)(((uint8_t *)src)[lVar13] ^ 0x80)))
              goto LAB_001b2415;
              *dest = (ushort)((bVar2 & 0x1f) << 6) | ((uint8_t *)src)[lVar13] ^ 0x80;
              local_60 = local_60 + 2;
            }
            else if (((bVar2 < 0xf0) && ((byte)(((uint8_t *)src)[lVar13] ^ 0x80) < 0x40)) &&
                    ((byte)(((uint8_t *)src)[lVar8 + 2] ^ 0x80) < 0x40)) {
              *dest = (ushort)bVar2 << 0xc | ((uint8_t *)src)[lVar8 + 2] ^ 0x80 |
                      (((uint8_t *)src)[lVar13] ^ 0x80) << 6;
              local_60 = local_60 + 3;
            }
            else {
LAB_001b2415:
              if (subchar < 0) goto LAB_001b2651;
              local_60 = (uint)lVar13;
              utf8_nextCharSafeBody_63((uint8_t *)src,(int32_t *)&local_60,srcLength,(uint)bVar2,-1)
              ;
              iVar19 = iVar19 + 1;
              *dest = (UChar)subchar;
            }
          }
          else {
            *dest = (ushort)bVar2;
            local_60 = (uint)lVar13;
          }
          dest = dest + 1;
          iVar15 = iVar15 + -1;
        } while (1 < iVar15);
      } while( true );
    }
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return (UChar *)0x0;
LAB_001b2529:
  *pUVar14 = (ushort)bVar2;
  pUVar14 = pUVar14 + 1;
  goto LAB_001b2477;
LAB_001b25ba:
  local_60 = uVar18;
  uVar11 = iVar6 + (int)(uVar16 >> 1);
  do {
    uVar12 = (ulong)uVar11;
    iVar6 = iVar6 + 1;
    if (srcLength <= (int)local_60) {
      if (pNumSubstitutions != (int32_t *)0x0) {
        *pNumSubstitutions = iVar19;
      }
      dest = local_58;
      destCapacity = local_5c;
      if (local_38 != (uint *)0x0) {
        *local_38 = uVar11;
      }
      goto LAB_001b268b;
    }
    lVar8 = (long)(int)local_60;
    lVar13 = lVar8 + 1;
    uVar18 = (uint)lVar13;
    bVar2 = ((uint8_t *)src)[lVar8];
    if (-1 < (char)bVar2) goto LAB_001b25ba;
    if (bVar2 < 0xe0) {
      if ((bVar2 < 0xc0) || (srcLength <= (int)uVar18)) break;
      uVar3 = ((uint8_t *)src)[lVar13];
      iVar10 = 2;
    }
    else {
      if (((0xef < bVar2) || (srcLength <= (int)(lVar8 + 2))) ||
         (-0x41 < (char)((uint8_t *)src)[lVar13])) break;
      uVar3 = ((uint8_t *)src)[lVar8 + 2];
      iVar10 = 3;
    }
    if (-0x41 < (char)uVar3) break;
    local_60 = local_60 + iVar10;
    uVar11 = uVar11 + 1;
  } while( true );
  if (subchar < 0) {
LAB_001b2651:
    *pErrorCode = U_INVALID_CHAR_FOUND;
    return (UChar *)0x0;
  }
  local_60 = uVar18;
  utf8_nextCharSafeBody_63((uint8_t *)src,(int32_t *)&local_60,srcLength,(uint)bVar2,-1);
  iVar19 = iVar19 + 1;
  uVar18 = local_60;
  goto LAB_001b25ba;
}

Assistant:

U_CAPI UChar* U_EXPORT2
u_strFromJavaModifiedUTF8WithSub(
        UChar *dest,
        int32_t destCapacity,
        int32_t *pDestLength,
        const char *src,
        int32_t srcLength,
        UChar32 subchar, int32_t *pNumSubstitutions,
        UErrorCode *pErrorCode) {
    /* args check */
    if(U_FAILURE(*pErrorCode)) {
        return NULL;
    }
    if( (src==NULL && srcLength!=0) || srcLength < -1 ||
        (dest==NULL && destCapacity!=0) || destCapacity<0 ||
        subchar > 0x10ffff || U_IS_SURROGATE(subchar)
    ) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    if(pNumSubstitutions!=NULL) {
        *pNumSubstitutions=0;
    }
    UChar *pDest = dest;
    UChar *pDestLimit = dest+destCapacity;
    int32_t reqLength = 0;
    int32_t numSubstitutions=0;

    if(srcLength < 0) {
        /*
         * Transform a NUL-terminated ASCII string.
         * Handle non-ASCII strings with slower code.
         */
        UChar32 c;
        while(((c = (uint8_t)*src) != 0) && c <= 0x7f && (pDest < pDestLimit)) {
            *pDest++=(UChar)c;
            ++src;
        }
        if(c == 0) {
            reqLength=(int32_t)(pDest - dest);
            if(pDestLength) {
                *pDestLength = reqLength;
            }

            /* Terminate the buffer */
            u_terminateUChars(dest, destCapacity, reqLength, pErrorCode);
            return dest;
        }
        srcLength = static_cast<int32_t>(uprv_strlen(src));
    }

    /* Faster loop without ongoing checking for srcLength and pDestLimit. */
    UChar32 ch;
    uint8_t t1, t2;
    int32_t i = 0;
    for(;;) {
        int32_t count = (int32_t)(pDestLimit - pDest);
        int32_t count2 = srcLength - i;
        if(count >= count2 && srcLength > 0 && U8_IS_SINGLE(*src)) {
            /* fast ASCII loop */
            int32_t start = i;
            uint8_t b;
            while(i < srcLength && U8_IS_SINGLE(b = src[i])) {
                *pDest++=b;
                ++i;
            }
            int32_t delta = i - start;
            count -= delta;
            count2 -= delta;
        }
        /*
         * Each iteration of the inner loop progresses by at most 3 UTF-8
         * bytes and one UChar.
         */
        if(subchar > 0xFFFF) {
            break;
        }
        count2 /= 3;
        if(count > count2) {
            count = count2; /* min(remaining dest, remaining src/3) */
        }
        if(count < 3) {
            /*
             * Too much overhead if we get near the end of the string,
             * continue with the next loop.
             */
            break;
        }
        do {
            ch = (uint8_t)src[i++];
            if(U8_IS_SINGLE(ch)) {
                *pDest++=(UChar)ch;
            } else {
                if(ch >= 0xe0) {
                    if( /* handle U+0000..U+FFFF inline */
                        ch <= 0xef &&
                        (t1 = (uint8_t)(src[i] - 0x80)) <= 0x3f &&
                        (t2 = (uint8_t)(src[i+1] - 0x80)) <= 0x3f
                    ) {
                        /* no need for (ch & 0xf) because the upper bits are truncated after <<12 in the cast to (UChar) */
                        *pDest++ = (UChar)((ch << 12) | (t1 << 6) | t2);
                        i += 2;
                        continue;
                    }
                } else {
                    if( /* handle U+0000..U+07FF inline */
                        ch >= 0xc0 &&
                        (t1 = (uint8_t)(src[i] - 0x80)) <= 0x3f
                    ) {
                        *pDest++ = (UChar)(((ch & 0x1f) << 6) | t1);
                        ++i;
                        continue;
                    }
                }

                if(subchar < 0) {
                    *pErrorCode = U_INVALID_CHAR_FOUND;
                    return NULL;
                } else if(subchar > 0xffff && --count == 0) {
                    /*
                     * We need to write two UChars, adjusted count for that,
                     * and ran out of space.
                     */
                    --i;  // back out byte ch
                    break;
                } else {
                    /* function call for error cases */
                    utf8_nextCharSafeBody((const uint8_t *)src, &(i), srcLength, ch, -1);
                    ++numSubstitutions;
                    *(pDest++)=(UChar)subchar;
                }
            }
        } while(--count > 0);
    }

    while(i < srcLength && (pDest < pDestLimit)) {
        ch = (uint8_t)src[i++];
        if(U8_IS_SINGLE(ch)){
            *pDest++=(UChar)ch;
        } else {
            if(ch >= 0xe0) {
                if( /* handle U+0000..U+FFFF inline */
                    ch <= 0xef &&
                    (i+1) < srcLength &&
                    (t1 = (uint8_t)(src[i] - 0x80)) <= 0x3f &&
                    (t2 = (uint8_t)(src[i+1] - 0x80)) <= 0x3f
                ) {
                    /* no need for (ch & 0xf) because the upper bits are truncated after <<12 in the cast to (UChar) */
                    *pDest++ = (UChar)((ch << 12) | (t1 << 6) | t2);
                    i += 2;
                    continue;
                }
            } else {
                if( /* handle U+0000..U+07FF inline */
                    ch >= 0xc0 &&
                    i < srcLength &&
                    (t1 = (uint8_t)(src[i] - 0x80)) <= 0x3f
                ) {
                    *pDest++ = (UChar)(((ch & 0x1f) << 6) | t1);
                    ++i;
                    continue;
                }
            }

            if(subchar < 0) {
                *pErrorCode = U_INVALID_CHAR_FOUND;
                return NULL;
            } else {
                /* function call for error cases */
                utf8_nextCharSafeBody((const uint8_t *)src, &(i), srcLength, ch, -1);
                ++numSubstitutions;
                if(subchar<=0xFFFF) {
                    *(pDest++)=(UChar)subchar;
                } else {
                    *(pDest++)=U16_LEAD(subchar);
                    if(pDest<pDestLimit) {
                        *(pDest++)=U16_TRAIL(subchar);
                    } else {
                        reqLength++;
                        break;
                    }
                }
            }
        }
    }

    /* Pre-flight the rest of the string. */
    while(i < srcLength) {
        ch = (uint8_t)src[i++];
        if(U8_IS_SINGLE(ch)) {
            reqLength++;
        } else {
            if(ch >= 0xe0) {
                if( /* handle U+0000..U+FFFF inline */
                    ch <= 0xef &&
                    (i+1) < srcLength &&
                    (uint8_t)(src[i] - 0x80) <= 0x3f &&
                    (uint8_t)(src[i+1] - 0x80) <= 0x3f
                ) {
                    reqLength++;
                    i += 2;
                    continue;
                }
            } else {
                if( /* handle U+0000..U+07FF inline */
                    ch >= 0xc0 &&
                    i < srcLength &&
                    (uint8_t)(src[i] - 0x80) <= 0x3f
                ) {
                    reqLength++;
                    ++i;
                    continue;
                }
            }

            if(subchar < 0) {
                *pErrorCode = U_INVALID_CHAR_FOUND;
                return NULL;
            } else {
                /* function call for error cases */
                utf8_nextCharSafeBody((const uint8_t *)src, &(i), srcLength, ch, -1);
                ++numSubstitutions;
                reqLength+=U16_LENGTH(ch);
            }
        }
    }

    if(pNumSubstitutions!=NULL) {
        *pNumSubstitutions=numSubstitutions;
    }

    reqLength+=(int32_t)(pDest - dest);
    if(pDestLength) {
        *pDestLength = reqLength;
    }

    /* Terminate the buffer */
    u_terminateUChars(dest, destCapacity, reqLength, pErrorCode);
    return dest;
}